

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

void __thiscall
prometheus::Gateway::RegisterCollectable
          (Gateway *this,weak_ptr<prometheus::Collectable> *collectable,Labels *labels)

{
  mutex *__mutex;
  int iVar1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  _Rb_tree_header *p_Var4;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  if (labels != (Labels *)0x0) {
    p_Var2 = (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(labels->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var4) {
      do {
        detail::encodeLabel(local_1a0,(Label *)(p_Var2 + 1));
        p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var4);
    }
  }
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    CleanupStalePointers(&this->collectables_);
    ::std::__cxx11::stringbuf::str();
    ::std::
    vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>
    ::emplace_back<std::weak_ptr<prometheus::Collectable>const&,std::__cxx11::string>
              ((vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>
                *)&this->collectables_,collectable,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    ::std::__cxx11::stringstream::~stringstream(local_1b0);
    ::std::ios_base::~ios_base(local_130);
    return;
  }
  uVar3 = ::std::__throw_system_error(iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  _Unwind_Resume(uVar3);
}

Assistant:

void Gateway::RegisterCollectable(const std::weak_ptr<Collectable>& collectable,
                                  const Labels* labels) {
  std::stringstream ss;

  if (labels) {
    for (auto& label : *labels) {
      detail::encodeLabel(ss, label);
    }
  }

  std::lock_guard<std::mutex> lock{mutex_};
  CleanupStalePointers(collectables_);
  collectables_.emplace_back(collectable, ss.str());
}